

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utpm_sample.c
# Opt level: O0

int main(void)

{
  _Bool _Var1;
  int iVar2;
  undefined1 local_308 [8];
  TPM_SAMPLE_INFO tpm_info;
  int result;
  
  tpm_info._756_4_ = 0;
  memset(local_308,0,0x2f8);
  iVar2 = platform_init();
  if (iVar2 == 0) {
    _Var1 = initialize_tpm((TPM_SAMPLE_INFO *)local_308);
    if (_Var1) {
      read_key_info((TPM2B_PUBLIC *)&tpm_info.tpm_device.comms_endpoint,"Endorsement Key: ");
      read_key_info((TPM2B_PUBLIC *)((long)&tpm_info.ek_pub.publicArea.unique + 0xfc),
                    "Storage Root Key: ");
      write_sign_data((TPM_SAMPLE_INFO *)local_308,"Data to be signed by tpm");
      retrieve_random_bytes();
      Deinit_TPM_Codec((TSS_DEVICE *)local_308);
      tpm_info.tpm_handle = 0;
    }
    else {
      tpm_info.tpm_handle = 0xe0;
    }
  }
  else {
    printf("platform_init failed\r\n");
    tpm_info.tpm_handle = 0xcf;
  }
  platform_deinit();
  getchar();
  return tpm_info.tpm_handle;
}

Assistant:

int main(void)
{
    int result;

    TPM_SAMPLE_INFO tpm_info = { 0 };
    if (platform_init() != 0)
    {
        (void)printf("platform_init failed\r\n");
        result = __LINE__;
    }
    else if (initialize_tpm(&tpm_info) )
    {
        read_key_info(&tpm_info.ek_pub, "Endorsement Key: ");
        read_key_info(&tpm_info.srk_pub, "Storage Root Key: ");

        write_sign_data(&tpm_info, "Data to be signed by tpm");

        retrieve_random_bytes();

        Deinit_TPM_Codec(&tpm_info.tpm_device);

        result = 0;
    }
    else
    {
        result = __LINE__;
    }

    platform_deinit();

    (void)getchar();
    return result;
}